

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void helper_tbegin_ppc64(CPUPPCState_conflict2 *env)

{
  CPUPPCState_conflict2 *env_local;
  
  env->spr[0x82] =
       (env->msr >> 0x3c & 1) << 0x1d | 0x140000000000000 | (env->msr >> 0xe & 1) << 0x1c |
       0xc000000;
  env->spr[0x81] = env->nip | (env->msr >> 0x3c & 1) << 1 | env->msr >> 0xe & 1;
  env->spr[0x80] = env->nip + 4;
  env->crf[0] = 0xb;
  return;
}

Assistant:

void helper_tbegin(CPUPPCState *env)
{
    /*
     * As a degenerate implementation, always fail tbegin.  The reason
     * given is "Nesting overflow".  The "persistent" bit is set,
     * providing a hint to the error handler to not retry.  The TFIAR
     * captures the address of the failure, which is this tbegin
     * instruction.  Instruction execution will continue with the next
     * instruction in memory, which is precisely what we want.
     */

    env->spr[SPR_TEXASR] =
        (1ULL << TEXASR_FAILURE_PERSISTENT) |
        (1ULL << TEXASR_NESTING_OVERFLOW) |
        (msr_hv << TEXASR_PRIVILEGE_HV) |
        (msr_pr << TEXASR_PRIVILEGE_PR) |
        (1ULL << TEXASR_FAILURE_SUMMARY) |
        (1ULL << TEXASR_TFIAR_EXACT);
    env->spr[SPR_TFIAR] = env->nip | (msr_hv << 1) | msr_pr;
    env->spr[SPR_TFHAR] = env->nip + 4;
    env->crf[0] = 0xB; /* 0b1010 = transaction failure */
}